

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

Box * __thiscall
amrex::BoxArray::minimalBox(Box *__return_storage_ptr__,BoxArray *this,Long *npts_avg_box)

{
  IntVect *pIVar1;
  element_type *peVar2;
  Box *this_00;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  IndexType IVar7;
  Long LVar8;
  Long LVar9;
  int dir_1;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  IntVect IVar17;
  int local_5c [3];
  long local_50;
  long *local_48;
  int local_40 [3];
  
  (__return_storage_ptr__->smallend).vect[0] = 1;
  (__return_storage_ptr__->smallend).vect[1] = 1;
  (__return_storage_ptr__->smallend).vect[2] = 1;
  (__return_storage_ptr__->bigend).vect[0] = 0;
  (__return_storage_ptr__->bigend).vect[1] = 0;
  *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = 0;
  peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar13 = 0x1c;
  local_50 = ((long)*(pointer *)
                     ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data + 8) - (long)this_00) / 0x1c;
  uVar6 = (uint)local_50;
  local_48 = npts_avg_box;
  if ((int)uVar6 < 1) {
    LVar8 = 0;
  }
  else {
    uVar3 = *(undefined8 *)(this_00->smallend).vect;
    uVar4 = *(undefined8 *)((this_00->smallend).vect + 2);
    uVar5 = *(undefined8 *)((this_00->bigend).vect + 2);
    *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)(this_00->bigend).vect;
    *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar5;
    *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar3;
    *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar4;
    LVar8 = Box::numPts(this_00);
    uVar16 = (ulong)(uVar6 & 0x7fffffff);
    while (uVar16 = uVar16 - 1, uVar16 != 0) {
      Box::minBox(__return_storage_ptr__,
                  (Box *)(*(long *)&(((this->m_ref).
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data + lVar13));
      LVar9 = Box::numPts((Box *)(*(long *)&(((this->m_ref).
                                              super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->m_abox).
                                            super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                            ._M_impl.super__Vector_impl_data + lVar13));
      LVar8 = LVar8 + LVar9;
      lVar13 = lVar13 + 0x1c;
    }
  }
  IVar17 = BATransformer::coarsen_ratio(&this->m_bat);
  iVar11 = IVar17.vect[2];
  local_40[0] = IVar17.vect[0];
  local_40[1] = IVar17.vect[1];
  local_40[2] = IVar17.vect[2];
  iVar15 = IVar17.vect[0];
  iVar12 = IVar17.vect[1];
  if (IVar17.vect._0_8_ >> 0x20 == 1 && iVar15 == 1) {
    if (iVar11 == 1) goto LAB_00512e8e;
    uVar6 = (__return_storage_ptr__->smallend).vect[1];
  }
  else {
    uVar6 = (__return_storage_ptr__->smallend).vect[0];
    if (iVar15 != 1) {
      if (iVar15 == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 2;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (iVar15 == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 1;
        }
        else {
          uVar6 = uVar6 >> 1;
        }
      }
      else if ((int)uVar6 < 0) {
        uVar6 = ~((int)~uVar6 / iVar15);
      }
      else {
        uVar6 = (int)uVar6 / iVar15;
      }
    }
    (__return_storage_ptr__->smallend).vect[0] = uVar6;
    uVar6 = (__return_storage_ptr__->smallend).vect[1];
    if (iVar12 != 1) {
      if (iVar12 == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 2;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (iVar12 == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 1;
        }
        else {
          uVar6 = uVar6 >> 1;
        }
      }
      else if ((int)uVar6 < 0) {
        uVar6 = ~((int)~uVar6 / iVar12);
      }
      else {
        uVar6 = (int)uVar6 / iVar12;
      }
    }
  }
  (__return_storage_ptr__->smallend).vect[1] = uVar6;
  uVar6 = (__return_storage_ptr__->smallend).vect[2];
  if (iVar11 != 1) {
    if (iVar11 == 4) {
      if ((int)uVar6 < 0) {
        uVar6 = (int)uVar6 >> 2;
      }
      else {
        uVar6 = uVar6 >> 2;
      }
    }
    else if (iVar11 == 2) {
      if ((int)uVar6 < 0) {
        uVar6 = (int)uVar6 >> 1;
      }
      else {
        uVar6 = uVar6 >> 1;
      }
    }
    else if ((int)uVar6 < 0) {
      uVar6 = ~((int)~uVar6 / iVar11);
    }
    else {
      uVar6 = (int)uVar6 / iVar11;
    }
  }
  pIVar1 = &__return_storage_ptr__->bigend;
  (__return_storage_ptr__->smallend).vect[2] = uVar6;
  uVar6 = (__return_storage_ptr__->btype).itype;
  if (uVar6 == 0) {
    uVar6 = pIVar1->vect[0];
    if (iVar15 != 1) {
      if (iVar15 == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 2;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (iVar15 == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 1;
        }
        else {
          uVar6 = uVar6 >> 1;
        }
      }
      else if ((int)uVar6 < 0) {
        uVar6 = ~((int)~uVar6 / iVar15);
      }
      else {
        uVar6 = (int)uVar6 / iVar15;
      }
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar6;
    uVar6 = (__return_storage_ptr__->bigend).vect[1];
    if (iVar12 != 1) {
      if (iVar12 == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 2;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (iVar12 == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 1;
        }
        else {
          uVar6 = uVar6 >> 1;
        }
      }
      else if ((int)uVar6 < 0) {
        uVar6 = ~((int)~uVar6 / iVar12);
      }
      else {
        uVar6 = (int)uVar6 / iVar12;
      }
    }
    (__return_storage_ptr__->bigend).vect[1] = uVar6;
    uVar6 = (__return_storage_ptr__->bigend).vect[2];
    if (iVar11 != 1) {
      if (iVar11 == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 2;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (iVar11 == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 1;
        }
        else {
          uVar6 = uVar6 >> 1;
        }
      }
      else if ((int)uVar6 < 0) {
        uVar6 = ~((int)~uVar6 / iVar11);
      }
      else {
        uVar6 = (int)uVar6 / iVar11;
      }
    }
  }
  else {
    local_5c[0] = 0;
    local_5c[1] = 0;
    local_5c[2] = 0;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      if (((uVar6 >> ((uint)lVar13 & 0x1f) & 1) != 0) &&
         (pIVar1->vect[lVar13] % local_40[lVar13] != 0)) {
        local_5c[lVar13] = 1;
      }
    }
    uVar10 = pIVar1->vect[0];
    if (iVar15 != 1) {
      if (iVar15 == 4) {
        if ((int)uVar10 < 0) {
          uVar10 = (int)uVar10 >> 2;
        }
        else {
          uVar10 = uVar10 >> 2;
        }
      }
      else if (iVar15 == 2) {
        if ((int)uVar10 < 0) {
          uVar10 = (int)uVar10 >> 1;
        }
        else {
          uVar10 = uVar10 >> 1;
        }
      }
      else if ((int)uVar10 < 0) {
        uVar10 = ~((int)~uVar10 / iVar15);
      }
      else {
        uVar10 = (int)uVar10 / iVar15;
      }
    }
    uVar14 = (__return_storage_ptr__->bigend).vect[1];
    if (iVar12 != 1) {
      if (iVar12 == 4) {
        if ((int)uVar14 < 0) {
          uVar14 = (int)uVar14 >> 2;
        }
        else {
          uVar14 = uVar14 >> 2;
        }
      }
      else if (iVar12 == 2) {
        if ((int)uVar14 < 0) {
          uVar14 = (int)uVar14 >> 1;
        }
        else {
          uVar14 = uVar14 >> 1;
        }
      }
      else if ((int)uVar14 < 0) {
        uVar14 = ~((int)~uVar14 / iVar12);
      }
      else {
        uVar14 = (int)uVar14 / iVar12;
      }
    }
    uVar6 = (__return_storage_ptr__->bigend).vect[2];
    if (iVar11 != 1) {
      if (iVar11 == 4) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 2;
        }
        else {
          uVar6 = uVar6 >> 2;
        }
      }
      else if (iVar11 == 2) {
        if ((int)uVar6 < 0) {
          uVar6 = (int)uVar6 >> 1;
        }
        else {
          uVar6 = uVar6 >> 1;
        }
      }
      else if ((int)uVar6 < 0) {
        uVar6 = ~((int)~uVar6 / iVar11);
      }
      else {
        uVar6 = (int)uVar6 / iVar11;
      }
    }
    (__return_storage_ptr__->bigend).vect[0] = uVar10 + local_5c[0];
    (__return_storage_ptr__->bigend).vect[1] = uVar14 + local_5c[1];
    uVar6 = uVar6 + local_5c[2];
  }
  (__return_storage_ptr__->bigend).vect[2] = uVar6;
LAB_00512e8e:
  IVar7 = BATransformer::index_type(&this->m_bat);
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    uVar10 = 1 << ((byte)lVar13 & 0x1f);
    uVar6 = (uint)lVar13;
    (__return_storage_ptr__->bigend).vect[lVar13] =
         ((__return_storage_ptr__->bigend).vect[lVar13] +
         (uint)((IVar7.itype >> (uVar6 & 0x1f) & 1) != 0)) -
         (uint)(((__return_storage_ptr__->btype).itype >> (uVar6 & 0x1f) & 1) != 0);
    if ((IVar7.itype >> (uVar6 & 0x1f) & 1) == 0) {
      uVar10 = ~uVar10 & (__return_storage_ptr__->btype).itype;
    }
    else {
      uVar10 = uVar10 | (__return_storage_ptr__->btype).itype;
    }
    (__return_storage_ptr__->btype).itype = uVar10;
  }
  *local_48 = (LVar8 / (long)(iVar11 * iVar15 * iVar12)) / (long)(int)local_50;
  return __return_storage_ptr__;
}

Assistant:

Box
BoxArray::minimalBox (Long& npts_avg_box) const
{
    BL_ASSERT(m_bat.is_simple());
    Box minbox;
    const int N = size();
    Long npts_tot = 0;
    if (N > 0)
    {
#ifdef AMREX_USE_OMP
        bool use_single_thread = omp_in_parallel();
        const int nthreads = use_single_thread ? 1 : omp_get_max_threads();
#else
        bool use_single_thread = true;
        const int nthreads = 1;
#endif
        if (use_single_thread)
        {
            minbox = m_ref->m_abox[0];
            npts_tot += m_ref->m_abox[0].numPts();
            for (int i = 1; i < N; ++i) {
                minbox.minBox(m_ref->m_abox[i]);
                npts_tot += m_ref->m_abox[i].numPts();
            }
        }
        else
        {
            Vector<Box> bxs(nthreads, m_ref->m_abox[0]);
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(+:npts_tot)
#endif
            {
                int tid = OpenMP::get_thread_num();
#ifdef AMREX_USE_OMP
#pragma omp for
#endif
                for (int i = 0; i < N; ++i) {
                    bxs[tid].minBox(m_ref->m_abox[i]);
                    Long npts = m_ref->m_abox[i].numPts();
                    npts_tot += npts;
                }
            }
            minbox = bxs[0];
            for (int i = 1; i < nthreads; ++i) {
                minbox.minBox(bxs[i]);
            }
        }
    }
    auto cr = crseRatio();
    minbox.coarsen(cr).convert(ixType());
    npts_tot /= AMREX_D_TERM(cr[0],*cr[1],*cr[2]);
    npts_avg_box = npts_tot / N;
    return minbox;
}